

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_sse4.c
# Opt level: O1

void cdef_copy_rect8_8bit_to_16bit_sse4_1
               (uint16_t *dst,int dstride,uint8_t *src,int sstride,int width,int height)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 in_XMM0 [16];
  
  if (0 < height) {
    uVar1 = 0;
    do {
      uVar2 = 0;
      if (0 < (int)(width & 0xfffffff8U)) {
        uVar2 = 0;
        do {
          in_XMM0 = pmovzxbw(in_XMM0,*(undefined8 *)(src + uVar2));
          *(undefined1 (*) [16])(dst + uVar2) = in_XMM0;
          uVar2 = uVar2 + 8;
        } while ((long)uVar2 < (long)(int)(width & 0xfffffff8U));
      }
      if ((int)uVar2 < width) {
        uVar2 = uVar2 & 0xffffffff;
        do {
          dst[uVar2] = (ushort)src[uVar2];
          uVar2 = uVar2 + 1;
        } while ((uint)width != uVar2);
      }
      uVar1 = uVar1 + 1;
      dst = dst + dstride;
      src = src + sstride;
    } while (uVar1 != (uint)height);
  }
  return;
}

Assistant:

void cdef_copy_rect8_8bit_to_16bit_sse4_1(uint16_t *dst, int dstride,
                                          const uint8_t *src, int sstride,
                                          int width, int height) {
  int j = 0;
  for (int i = 0; i < height; i++) {
    for (j = 0; j < (width & ~0x7); j += 8) {
      v64 row = v64_load_unaligned(&src[i * sstride + j]);
      v128_store_unaligned(&dst[i * dstride + j], v128_unpack_u8_s16(row));
    }
    for (; j < width; j++) {
      dst[i * dstride + j] = src[i * sstride + j];
    }
  }
}